

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void pushOntoSorter(Parse *pParse,ExprList *pOrderBy,Select *pSelect,int regData)

{
  int iVar1;
  int target;
  Vdbe *p;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int p2;
  int p3;
  
  iVar1 = pOrderBy->nExpr;
  p2 = iVar1 + 2;
  if (pParse->nRangeReg < p2) {
    target = pParse->nMem + 1;
    pParse->nMem = pParse->nMem + p2;
  }
  else {
    target = pParse->iRangeReg;
    pParse->iRangeReg = p2 + target;
    pParse->nRangeReg = pParse->nRangeReg - p2;
  }
  p = pParse->pVdbe;
  if (pParse->nTempReg == '\0') {
    p3 = pParse->nMem + 1;
    pParse->nMem = p3;
  }
  else {
    bVar2 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar2;
    p3 = pParse->aTempReg[bVar2];
  }
  sqlite3ExprCacheClear(pParse);
  sqlite3ExprCodeExprList(pParse,pOrderBy,target,0);
  sqlite3VdbeAddOp3(p,0x37,pOrderBy->iECursor,iVar1 + target,0);
  sqlite3ExprCodeMove(pParse,regData,iVar1 + target + 1,1);
  sqlite3VdbeAddOp3(p,0x1f,target,p2,p3);
  sqlite3VdbeAddOp3(p,((pSelect->selFlags & 0x40) == 0) + 0x60,pOrderBy->iECursor,p3,0);
  if (p3 != 0) {
    bVar2 = pParse->nTempReg;
    if ((ulong)bVar2 < 8) {
      lVar5 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar5) == p3) {
          (&pParse->aColCache[0].tempReg)[lVar5] = '\x01';
          goto LAB_0016c87b;
        }
        lVar5 = lVar5 + 0x18;
      } while ((int)lVar5 != 0xf0);
      pParse->nTempReg = bVar2 + 1;
      pParse->aTempReg[bVar2] = p3;
    }
  }
LAB_0016c87b:
  sqlite3ExprCacheRemove(pParse,target,p2);
  if (pParse->nRangeReg < p2) {
    pParse->nRangeReg = p2;
    pParse->iRangeReg = target;
  }
  if (pSelect->iLimit != 0) {
    iVar1 = pSelect->iOffset + 1;
    if (pSelect->iOffset == 0) {
      iVar1 = pSelect->iLimit;
    }
    uVar3 = sqlite3VdbeAddOp3(p,0x7a,iVar1,0,0);
    sqlite3VdbeAddOp3(p,0x14,iVar1,-1,0);
    uVar4 = sqlite3VdbeAddOp3(p,1,0,0,0);
    if ((-1 < (int)uVar3) && (uVar3 < (uint)p->nOp)) {
      p->aOp[uVar3].p2 = p->nOp;
    }
    sqlite3VdbeAddOp3(p,0x43,pOrderBy->iECursor,0,0);
    sqlite3VdbeAddOp3(p,0x3b,pOrderBy->iECursor,0,0);
    if ((-1 < (int)uVar4) && (uVar4 < (uint)p->nOp)) {
      p->aOp[uVar4].p2 = p->nOp;
    }
  }
  return;
}

Assistant:

static void pushOntoSorter(
  Parse *pParse,         /* Parser context */
  ExprList *pOrderBy,    /* The ORDER BY clause */
  Select *pSelect,       /* The whole SELECT statement */
  int regData            /* Register holding data to be sorted */
){
  Vdbe *v = pParse->pVdbe;
  int nExpr = pOrderBy->nExpr;
  int regBase = sqlite3GetTempRange(pParse, nExpr+2);
  int regRecord = sqlite3GetTempReg(pParse);
  int op;
  sqlite3ExprCacheClear(pParse);
  sqlite3ExprCodeExprList(pParse, pOrderBy, regBase, 0);
  sqlite3VdbeAddOp2(v, OP_Sequence, pOrderBy->iECursor, regBase+nExpr);
  sqlite3ExprCodeMove(pParse, regData, regBase+nExpr+1, 1);
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase, nExpr + 2, regRecord);
  if( pSelect->selFlags & SF_UseSorter ){
    op = OP_SorterInsert;
  }else{
    op = OP_IdxInsert;
  }
  sqlite3VdbeAddOp2(v, op, pOrderBy->iECursor, regRecord);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3ReleaseTempRange(pParse, regBase, nExpr+2);
  if( pSelect->iLimit ){
    int addr1, addr2;
    int iLimit;
    if( pSelect->iOffset ){
      iLimit = pSelect->iOffset+1;
    }else{
      iLimit = pSelect->iLimit;
    }
    addr1 = sqlite3VdbeAddOp1(v, OP_IfZero, iLimit);
    sqlite3VdbeAddOp2(v, OP_AddImm, iLimit, -1);
    addr2 = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp1(v, OP_Last, pOrderBy->iECursor);
    sqlite3VdbeAddOp1(v, OP_Delete, pOrderBy->iECursor);
    sqlite3VdbeJumpHere(v, addr2);
  }
}